

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O0

void __thiscall
agg::pod_bvector<agg::point_base<double>,_6U>::modify_last
          (pod_bvector<agg::point_base<double>,_6U> *this,point_base<double> *val)

{
  point_base<double> *val_local;
  pod_bvector<agg::point_base<double>,_6U> *this_local;
  
  remove_last(this);
  add(this,val);
  return;
}

Assistant:

void pod_bvector<T, S>::modify_last(const T& val)
    {
        remove_last();
        add(val);
    }